

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * tinyformat::format<unsigned_long>
                   (string *__return_storage_ptr__,string *fmt,unsigned_long *args)

{
  long in_FS_OFFSET;
  ostringstream oss;
  undefined1 auStack_1c8 [376];
  FormatArg *local_50;
  undefined4 local_48;
  FormatArg local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1c8);
  local_50 = &local_40;
  local_48 = 1;
  local_40.m_formatImpl = detail::FormatArg::formatImpl<unsigned_long>;
  local_40.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_long>;
  local_40.m_value = args;
  detail::formatImpl((ostream *)auStack_1c8,(fmt->_M_dataplus)._M_p,local_50,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1c8);
  std::ios_base::~ios_base((ios_base *)(auStack_1c8 + 0x70));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const std::string &fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt.c_str(), args...);
    return oss.str();
}